

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::RelayTransaction
          (PeerManagerImpl *this,uint256 *txid,uint256 *wtxid)

{
  long lVar1;
  Span<const_unsigned_char> vKey;
  bool bVar2;
  TxRelay *pTVar3;
  CRollingBloomFilter *in_RDX;
  CRollingBloomFilter *in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<uint256>,_bool> pVar4;
  uint256 *hash;
  TxRelay *tx_relay;
  Peer *peer;
  pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_> *it;
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock48;
  Mutex *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  _Rb_tree_const_iterator<uint256> in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  CRollingBloomFilter *in_stack_ffffffffffffff18;
  CRollingBloomFilter *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  microseconds *in_stack_ffffffffffffff30;
  seconds in_stack_ffffffffffffff38;
  TxRelay *pTVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff38.__r,
             (AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (char *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  std::
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  ::begin((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  std::
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  ::end((map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff08._M_node,
                                 (_Self *)CONCAT17(in_stack_ffffffffffffff07,
                                                   in_stack_ffffffffffffff00)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>::
    operator*((_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
               *)in_stack_fffffffffffffef8);
    std::__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_ffffffffffffff08._M_node);
    pTVar3 = Peer::GetTxRelay((Peer *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00))
    ;
    if (pTVar3 != (TxRelay *)0x0) {
      pTVar5 = pTVar3;
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff38.__r,
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff30,
                 (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 (char *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
      in_stack_ffffffffffffff30 = &pTVar3->m_next_inv_send_time;
      in_stack_ffffffffffffff38 = s<(char)48>();
      in_stack_ffffffffffffff2f =
           std::chrono::operator==
                     ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff18,
                      (duration<long,_std::ratio<1L,_1L>_> *)
                      CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      if (!(bool)in_stack_ffffffffffffff2f) {
        bVar2 = std::atomic::operator_cast_to_bool
                          ((atomic<bool> *)
                           CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        in_stack_ffffffffffffff20 = in_RDX;
        if (!bVar2) {
          in_stack_ffffffffffffff20 = in_RSI;
        }
        in_stack_ffffffffffffff18 = &pTVar3->m_tx_inventory_known_filter;
        Span<const_unsigned_char>::Span<uint256>
                  ((Span<const_unsigned_char> *)in_stack_ffffffffffffff08._M_node,
                   (uint256 *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8);
        vKey.m_size = in_RDI;
        vKey.m_data = (uchar *)pTVar5;
        in_stack_ffffffffffffff17 = CRollingBloomFilter::contains(in_stack_ffffffffffffff20,vKey);
        if (!(bool)in_stack_ffffffffffffff17) {
          pVar4 = _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::
                  insert((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                         in_stack_ffffffffffffff08._M_node,
                         (value_type *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00)
                        );
          in_stack_ffffffffffffff08 = pVar4.first._M_node;
          in_stack_ffffffffffffff07 = pVar4.second;
        }
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
    }
    std::_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
                *)in_stack_fffffffffffffef8);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::RelayTransaction(const uint256& txid, const uint256& wtxid)
{
    LOCK(m_peer_mutex);
    for(auto& it : m_peer_map) {
        Peer& peer = *it.second;
        auto tx_relay = peer.GetTxRelay();
        if (!tx_relay) continue;

        LOCK(tx_relay->m_tx_inventory_mutex);
        // Only queue transactions for announcement once the version handshake
        // is completed. The time of arrival for these transactions is
        // otherwise at risk of leaking to a spy, if the spy is able to
        // distinguish transactions received during the handshake from the rest
        // in the announcement.
        if (tx_relay->m_next_inv_send_time == 0s) continue;

        const uint256& hash{peer.m_wtxid_relay ? wtxid : txid};
        if (!tx_relay->m_tx_inventory_known_filter.contains(hash)) {
            tx_relay->m_tx_inventory_to_send.insert(hash);
        }
    };
}